

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters
          (KotlinKMPGenerator *this,StructDef *struct_def,CodeWriter *writer)

{
  IdlNamer *pIVar1;
  BaseType BVar2;
  FieldDef *field;
  FieldDef *pFVar3;
  StructDef *pSVar4;
  pointer ppFVar5;
  unsigned_long t;
  BaseType BVar6;
  Value *pVVar7;
  string params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_1;
  string qualified_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> param2;
  string field_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rtype;
  string offset_val;
  string field_type;
  FieldDef *key_field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  pointer local_150;
  string return_type;
  string field_default_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string bbgetter;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> fields_vec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> offset_prefix;
  string local_90;
  string local_70;
  string local_50;
  
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            (&fields_vec,&(struct_def->fields).vec);
  key_field = (FieldDef *)0x0;
  pIVar1 = &this->namer_;
  do {
    if (fields_vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        fields_vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      if ((struct_def->has_key != false) && (struct_def->fixed == false)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&field_name,"keysCompare",(allocator<char> *)&offset_val);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&field_type,"o1: Offset<*>, o2: Offset<*>, buffer: ReadWriteBuffer",
                   (allocator<char> *)&offset_prefix);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&field_default_value,"Int",(allocator<char> *)&qualified_name);
        bbgetter._M_dataplus._M_p = (pointer)&key_field;
        bbgetter._M_string_length = (size_type)writer;
        bbgetter.field_2._M_allocated_capacity = (size_type)this;
        std::function<void()>::
        function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_16_,void>
                  ((function<void()> *)&return_type,(anon_class_24_3_5f35eaae *)&bbgetter);
        GenerateOverrideFun(writer,&field_name,&field_type,&field_default_value,
                            (function<void_()> *)&return_type);
        std::_Function_base::~_Function_base((_Function_base *)&return_type);
        std::__cxx11::string::~string((string *)&field_default_value);
        std::__cxx11::string::~string((string *)&field_type);
        std::__cxx11::string::~string((string *)&field_name);
      }
      std::_Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
      ~_Vector_base(&fields_vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   );
      return;
    }
    field = *fields_vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (field->deprecated == false) {
      if (field->key == true) {
        key_field = field;
      }
      local_150 = fields_vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      GenerateComment(this,&(field->super_Definition).doc_comment,writer,
                      (CommentConfig *)(anonymous_namespace)::comment_config);
      (*(pIVar1->super_Namer)._vptr_Namer[0x12])(&field_name,pIVar1,field);
      pVVar7 = &field->value;
      GenTypeGet_abi_cxx11_(&field_type,this,&pVVar7->type);
      GenDefaultValue_abi_cxx11_(&field_default_value,this,field);
      GetterReturnType_abi_cxx11_(&return_type,this,field);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"bb",(allocator<char> *)&offset_val);
      ByteBufferGetter(&bbgetter,this,&pVVar7->type,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      NumToString<unsigned_short>(&offset_val,(field->value).offset);
      std::operator+(&qualified_name,"val o = offset(",&offset_val);
      std::operator+(&offset_prefix,&qualified_name,"); return o != 0 ? ");
      std::__cxx11::string::~string((string *)&qualified_name);
      BVar2 = (pVVar7->type).base_type;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&qualified_name,"offset",(allocator<char> *)&params_1);
      NumToString<unsigned_short>(&params,(field->value).offset);
      CodeWriter::SetValue(writer,&qualified_name,&params);
      std::__cxx11::string::~string((string *)&params);
      std::__cxx11::string::~string((string *)&qualified_name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&qualified_name,"return_type",(allocator<char> *)&params);
      CodeWriter::SetValue(writer,&qualified_name,&return_type);
      std::__cxx11::string::~string((string *)&qualified_name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&qualified_name,"field_type",(allocator<char> *)&params);
      CodeWriter::SetValue(writer,&qualified_name,&field_type);
      std::__cxx11::string::~string((string *)&qualified_name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&qualified_name,"field_name",(allocator<char> *)&params);
      CodeWriter::SetValue(writer,&qualified_name,&field_name);
      std::__cxx11::string::~string((string *)&qualified_name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&qualified_name,"field_default",(allocator<char> *)&params);
      CodeWriter::SetValue(writer,&qualified_name,&field_default_value);
      std::__cxx11::string::~string((string *)&qualified_name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&qualified_name,"bbgetter",(allocator<char> *)&params);
      CodeWriter::SetValue(writer,&qualified_name,&bbgetter);
      std::__cxx11::string::~string((string *)&qualified_name);
      if (BVar2 == BASE_TYPE_VECTOR) {
        if ((field->value).type.element == BASE_TYPE_STRUCT) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&qualified_name,"j: Int",(allocator<char> *)&params_1);
          params._M_string_length = 0;
          params.field_2._8_8_ =
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1042:71)>
               ::_M_invoke;
          params.field_2._M_allocated_capacity =
               (size_type)
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1042:71)>
               ::_M_manager;
          params._M_dataplus._M_p = (pointer)writer;
          GenerateFunOneLine(writer,&field_name,&qualified_name,&return_type,
                             (function<void_()> *)&params,false);
          std::_Function_base::~_Function_base((_Function_base *)&params);
          std::__cxx11::string::~string((string *)&qualified_name);
        }
switchD_0019b635_caseD_e:
        qualified_name._M_dataplus._M_p._4_4_ = 0;
        qualified_name._M_dataplus._M_p._0_4_ = (field->value).type.element;
        qualified_name._M_string_length = (size_type)(field->value).type.struct_def;
        qualified_name.field_2._M_allocated_capacity = (size_type)(field->value).type.enum_def;
        qualified_name.field_2._8_2_ = (field->value).type.fixed_length;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&params,"j: Int",(allocator<char> *)&params_1);
        if ((BaseType)qualified_name._M_dataplus._M_p - 0xf < 2) {
          std::operator+(&rtype,"obj: ",&field_type);
          std::operator+(&params_1,&rtype,", j: Int");
          std::__cxx11::string::operator=((string *)&params,(string *)&params_1);
          std::__cxx11::string::~string((string *)&params_1);
          std::__cxx11::string::~string((string *)&rtype);
        }
        rtype.field_2._M_allocated_capacity = (size_type)&offset_val;
        rtype._M_dataplus._M_p = (pointer)&qualified_name;
        rtype._M_string_length = (size_type)writer;
        std::function<void()>::
        function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_8_,void>
                  ((function<void()> *)&params_1,(anon_class_24_3_6239dc46 *)&rtype);
        GenerateFunOneLine(writer,&field_name,&params,&return_type,(function<void_()> *)&params_1,
                           false);
        std::_Function_base::~_Function_base((_Function_base *)&params_1);
        std::__cxx11::string::~string((string *)&params);
        std::operator+(&qualified_name,&field_name,"Length");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&params,"Int",(allocator<char> *)&rtype);
        params_1._M_string_length = (size_type)&offset_val;
        params_1.field_2._8_8_ =
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1171:69)>
             ::_M_invoke;
        params_1.field_2._M_allocated_capacity =
             (size_type)
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1171:69)>
             ::_M_manager;
        params_1._M_dataplus._M_p = (pointer)writer;
        GenerateGetterOneLine(writer,&qualified_name,&params,(function<void_()> *)&params_1);
        std::_Function_base::~_Function_base((_Function_base *)&params_1);
        std::__cxx11::string::~string((string *)&params);
        std::__cxx11::string::~string((string *)&qualified_name);
        BVar6 = (field->value).type.element;
        if (BVar6 == BASE_TYPE_STRUCT) {
          pSVar4 = (field->value).type.struct_def;
          if (pSVar4->fixed == false) {
            ppFVar5 = (pSVar4->fields).vec.
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              if (ppFVar5 ==
                  (pSVar4->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0019bb55;
              pFVar3 = *ppFVar5;
              ppFVar5 = ppFVar5 + 1;
            } while (pFVar3->key != true);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&params,"",(allocator<char> *)&params_1);
            TypeInNameSpace(&qualified_name,this,&pSVar4->super_Definition,&params);
            std::__cxx11::string::~string((string *)&params);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&params_1,"ByKey",(allocator<char> *)&rtype);
            (*(pIVar1->super_Namer)._vptr_Namer[3])(&params,pIVar1,field,&params_1);
            std::__cxx11::string::~string((string *)&params_1);
            pVVar7 = &pFVar3->value;
            GenTypeGet_abi_cxx11_(&rtype,this,&pVVar7->type);
            std::operator+(&params_1,"key: ",&rtype);
            std::__cxx11::string::~string((string *)&rtype);
            std::operator+(&rtype,&qualified_name,"?");
            local_170._M_string_length = (size_type)&offset_val;
            local_170._M_dataplus._M_p = (pointer)writer;
            local_170.field_2._M_allocated_capacity = (size_type)&qualified_name;
            std::function<void()>::
            function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_11_,void>
                      ((function<void()> *)&param2,(anon_class_24_3_aa68e553 *)&local_170);
            GenerateFunOneLine(writer,&params,&params_1,&rtype,(function<void_()> *)&param2,false);
            std::_Function_base::~_Function_base((_Function_base *)&param2);
            std::operator+(&local_108,"obj: ",&qualified_name);
            std::operator+(&local_170,&local_108,", key: ");
            GenTypeGet_abi_cxx11_(&local_70,this,&pVVar7->type);
            std::operator+(&param2,&local_170,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_170);
            std::__cxx11::string::~string((string *)&local_108);
            local_108._M_string_length = (size_type)&offset_val;
            local_108._M_dataplus._M_p = (pointer)writer;
            local_108.field_2._M_allocated_capacity = (size_type)&qualified_name;
            std::function<void()>::
            function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_12_,void>
                      ((function<void()> *)&local_170,(anon_class_24_3_aa68e553 *)&local_108);
            GenerateFunOneLine(writer,&params,&param2,&rtype,(function<void_()> *)&local_170,false);
            std::_Function_base::~_Function_base((_Function_base *)&local_170);
            std::__cxx11::string::~string((string *)&param2);
            std::__cxx11::string::~string((string *)&rtype);
            std::__cxx11::string::~string((string *)&params_1);
            std::__cxx11::string::~string((string *)&params);
            std::__cxx11::string::~string((string *)&qualified_name);
            BVar6 = (field->value).type.element;
            if (BVar6 - BASE_TYPE_UTYPE < 0xc) {
              t = 1;
              if (BVar2 == BASE_TYPE_STRING) goto LAB_0019bb6b;
              goto LAB_0019bad2;
            }
LAB_0019bb55:
            if (BVar2 == BASE_TYPE_STRING) goto LAB_0019bb63;
          }
        }
        else if (BVar6 - BASE_TYPE_UTYPE < 0xc) {
LAB_0019bad2:
          params._M_dataplus._M_p._4_4_ = 0;
          params._M_dataplus._M_p._0_4_ = BVar6;
          params._M_string_length = (size_type)(field->value).type.struct_def;
          params.field_2._M_allocated_capacity = (size_type)(field->value).type.enum_def;
          params.field_2._8_2_ = (field->value).type.fixed_length;
          t = InlineSize((Type *)&params);
LAB_0019bb6b:
          NumToString<unsigned_long>(&qualified_name,t);
          std::operator+(&params,&field_name,"AsBuffer");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&params_1,"",(allocator<char> *)&local_170);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&rtype,"ReadBuffer",(allocator<char> *)&local_108);
          param2.field_2._8_8_ =
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1222:64)>
               ::_M_invoke;
          param2.field_2._M_allocated_capacity =
               (size_type)
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1222:64)>
               ::_M_manager;
          param2._M_dataplus._M_p = (pointer)writer;
          param2._M_string_length = (size_type)&qualified_name;
          GenerateFunOneLine(writer,&params,&params_1,&rtype,(function<void_()> *)&param2,false);
          std::_Function_base::~_Function_base((_Function_base *)&param2);
          std::__cxx11::string::~string((string *)&rtype);
          std::__cxx11::string::~string((string *)&params_1);
          std::__cxx11::string::~string((string *)&params);
          goto LAB_0019bc33;
        }
      }
      else {
        if (BVar2 == BASE_TYPE_STRUCT) {
          qualified_name._M_string_length = 0;
          qualified_name.field_2._8_8_ =
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1034:64)>
               ::_M_invoke;
          qualified_name.field_2._M_allocated_capacity =
               (size_type)
               std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1034:64)>
               ::_M_manager;
          qualified_name._M_dataplus._M_p = (pointer)writer;
          GenerateGetterOneLine
                    (writer,&field_name,&return_type,(function<void_()> *)&qualified_name);
          std::_Function_base::~_Function_base((_Function_base *)&qualified_name);
switchD_0019b635_caseD_f:
          if (struct_def->fixed == true) {
            std::operator+(&qualified_name,"obj: ",&field_type);
            params._M_string_length = 0;
            params.field_2._8_8_ =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1070:74)>
                 ::_M_invoke;
            params.field_2._M_allocated_capacity =
                 (size_type)
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1070:74)>
                 ::_M_manager;
            params._M_dataplus._M_p = (pointer)writer;
            GenerateFunOneLine(writer,&field_name,&qualified_name,&return_type,
                               (function<void_()> *)&params,false);
          }
          else {
            std::operator+(&qualified_name,"obj: ",&field_type);
            params_1.field_2._M_allocated_capacity = (size_type)&offset_val;
            params_1._M_dataplus._M_p = (pointer)field;
            params_1._M_string_length = (size_type)writer;
            std::function<void()>::
            function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_6_,void>
                      ((function<void()> *)&params,(anon_class_24_3_3a33afe5 *)&params_1);
            GenerateFunOneLine(writer,&field_name,&qualified_name,&return_type,
                               (function<void_()> *)&params,false);
          }
        }
        else {
          if (BVar2 - BASE_TYPE_UTYPE < 0xc) {
            if (struct_def->fixed == true) {
              params._M_dataplus._M_p = (pointer)writer;
              params._M_string_length = (size_type)this;
              params.field_2._M_allocated_capacity = (size_type)field;
              std::function<void()>::
              function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_3_,void>
                        ((function<void()> *)&qualified_name,(anon_class_24_3_d986f876 *)&params);
              GenerateGetterOneLine
                        (writer,&field_name,&return_type,(function<void_()> *)&qualified_name);
            }
            else {
              params._M_string_length = (size_type)&offset_val;
              params._M_dataplus._M_p = (pointer)writer;
              params.field_2._M_allocated_capacity = (size_type)this;
              params.field_2._8_8_ = field;
              std::function<void()>::
              function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_4_,void>
                        ((function<void()> *)&qualified_name,(anon_class_32_4_eefdf39f *)&params);
              GenerateGetterOneLine
                        (writer,&field_name,&return_type,(function<void_()> *)&qualified_name);
            }
            std::_Function_base::~_Function_base((_Function_base *)&qualified_name);
            goto LAB_0019bc3b;
          }
          switch(BVar2) {
          case BASE_TYPE_STRING:
            qualified_name._M_string_length = (size_type)&offset_val;
            qualified_name.field_2._8_8_ =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1104:68)>
                 ::_M_invoke;
            qualified_name.field_2._M_allocated_capacity =
                 (size_type)
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1104:68)>
                 ::_M_manager;
            qualified_name._M_dataplus._M_p = (pointer)writer;
            GenerateGetterOneLine
                      (writer,&field_name,&return_type,(function<void_()> *)&qualified_name);
            std::_Function_base::~_Function_base((_Function_base *)&qualified_name);
LAB_0019bb63:
            t = 1;
            goto LAB_0019bb6b;
          case BASE_TYPE_VECTOR:
            goto switchD_0019b635_caseD_e;
          case BASE_TYPE_STRUCT:
            goto switchD_0019b635_caseD_f;
          case BASE_TYPE_UNION:
            std::operator+(&qualified_name,"obj: ",&field_type);
            params_1._M_string_length = (size_type)&offset_val;
            params_1.field_2._M_allocated_capacity = (size_type)&bbgetter;
            params_1._M_dataplus._M_p = (pointer)writer;
            std::function<void()>::
            function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_9_,void>
                      ((function<void()> *)&params,(anon_class_24_3_8247fe50 *)&params_1);
            GenerateFunOneLine(writer,&field_name,&qualified_name,&return_type,
                               (function<void_()> *)&params,false);
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp"
                          ,0x48d,
                          "void flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(StructDef &, CodeWriter &) const"
                         );
          }
        }
        std::_Function_base::~_Function_base((_Function_base *)&params);
LAB_0019bc33:
        std::__cxx11::string::~string((string *)&qualified_name);
      }
LAB_0019bc3b:
      pSVar4 = field->nested_flatbuffer;
      if (pSVar4 != (StructDef *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&params,"",(allocator<char> *)&params_1);
        TypeInNameSpace(&qualified_name,this,&pSVar4->super_Definition,&params);
        std::__cxx11::string::~string((string *)&params);
        std::operator+(&params_1,&field_name,"As");
        std::operator+(&params,&params_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       field->nested_flatbuffer);
        std::__cxx11::string::~string((string *)&params_1);
        std::operator+(&params_1,&qualified_name,"?");
        param2._M_dataplus._M_p = (pointer)writer;
        param2._M_string_length = (size_type)&params;
        param2.field_2._M_allocated_capacity = (size_type)&qualified_name;
        std::function<void()>::
        function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_14_,void>
                  ((function<void()> *)&rtype,(anon_class_24_3_47cc0641 *)&param2);
        GenerateGetterOneLine(writer,&params,&params_1,(function<void_()> *)&rtype);
        std::_Function_base::~_Function_base((_Function_base *)&rtype);
        std::__cxx11::string::~string((string *)&params_1);
        std::operator+(&params_1,"obj: ",&qualified_name);
        std::operator+(&rtype,&qualified_name,"?");
        param2._M_string_length = (size_type)&offset_val;
        param2.field_2._8_8_ =
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1244:37)>
             ::_M_invoke;
        param2.field_2._M_allocated_capacity =
             (size_type)
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:1244:37)>
             ::_M_manager;
        param2._M_dataplus._M_p = (pointer)writer;
        GenerateFunOneLine(writer,&params,&params_1,&rtype,(function<void_()> *)&param2,false);
        std::_Function_base::~_Function_base((_Function_base *)&param2);
        std::__cxx11::string::~string((string *)&rtype);
        std::__cxx11::string::~string((string *)&params_1);
        std::__cxx11::string::~string((string *)&params);
        std::__cxx11::string::~string((string *)&qualified_name);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"",(allocator<char> *)&qualified_name);
      CodeWriter::operator+=(writer,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&offset_prefix);
      std::__cxx11::string::~string((string *)&offset_val);
      std::__cxx11::string::~string((string *)&bbgetter);
      std::__cxx11::string::~string((string *)&return_type);
      std::__cxx11::string::~string((string *)&field_default_value);
      std::__cxx11::string::~string((string *)&field_type);
      std::__cxx11::string::~string((string *)&field_name);
      fields_vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start = local_150;
    }
    fields_vec.super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         fields_vec.
         super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
         _M_impl.super__Vector_impl_data._M_start + 1;
  } while( true );
}

Assistant:

void GenerateStructGetters(StructDef &struct_def, CodeWriter &writer) const {
    auto fields_vec = struct_def.fields.vec;
    FieldDef *key_field = nullptr;
    for (auto it = fields_vec.begin(); it != fields_vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (field.key) key_field = &field;

      GenerateComment(field.doc_comment, writer, &comment_config);

      auto field_name = namer_.Field(field);
      auto field_type = GenTypeGet(field.value.type);
      auto field_default_value = GenDefaultValue(field);
      auto return_type = GetterReturnType(field);
      auto bbgetter = ByteBufferGetter(field.value.type, "bb");
      auto offset_val = NumToString(field.value.offset);
      auto offset_prefix =
          "val o = offset(" + offset_val + "); return o != 0 ? ";
      auto value_base_type = field.value.type.base_type;
      // Most field accessors need to retrieve and test the field offset
      // first, this is the offset value for that:
      writer.SetValue("offset", NumToString(field.value.offset));
      writer.SetValue("return_type", return_type);
      writer.SetValue("field_type", field_type);
      writer.SetValue("field_name", field_name);
      writer.SetValue("field_default", field_default_value);
      writer.SetValue("bbgetter", bbgetter);
      // Generate the accessors that don't do object reuse.
      if (value_base_type == BASE_TYPE_STRUCT) {
        // Calls the accessor that takes an accessor object with a
        // new object.
        // val pos
        //     get() = pos(Vec3())
        GenerateGetterOneLine(writer, field_name, return_type, [&]() {
          writer += "{{field_name}}({{field_type}}())";
        });
      } else if (value_base_type == BASE_TYPE_VECTOR &&
                 field.value.type.element == BASE_TYPE_STRUCT) {
        // Accessors for vectors of structs also take accessor objects,
        // this generates a variant without that argument.
        // ex: fun weapons(j: Int) = weapons(Weapon(), j)
        GenerateFunOneLine(writer, field_name, "j: Int", return_type, [&]() {
          writer += "{{field_name}}({{field_type}}(), j)";
        });
      }

      if (IsScalar(value_base_type)) {
        if (struct_def.fixed) {
          GenerateGetterOneLine(writer, field_name, return_type, [&]() {
            std::string found = "{{bbgetter}}(bufferPos + {{offset}})";
            writer += WrapEnumValue(field.value.type, found);
          });
        } else {
          GenerateGetterOneLine(writer, field_name, return_type, [&]() {
            std::string found = "{{bbgetter}}(it + bufferPos)";
            writer += LookupFieldOneLine(offset_val,
                                         WrapEnumValue(field.value.type, found),
                                         "{{field_default}}");
          });
        }
      } else {
        switch (value_base_type) {
          case BASE_TYPE_STRUCT:
            if (struct_def.fixed) {
              // create getter with object reuse
              // ex:
              // fun pos(obj: Vec3) : Vec3? = obj.init(bufferPos + 4, bb)
              // ? adds nullability annotation
              GenerateFunOneLine(
                  writer, field_name, "obj: " + field_type, return_type, [&]() {
                    writer += "obj.init(bufferPos + {{offset}}, bb)";
                  });
            } else {
              // create getter with object reuse
              // ex:
              //  fun pos(obj: Vec3) : Vec3? {
              //      val o = offset(4)
              //      return if(o != 0) {
              //          obj.init(o + bufferPos, bb)
              //      else {
              //          null
              //      }
              //  }
              // ? adds nullability annotation
              GenerateFunOneLine(
                  writer, field_name, "obj: " + field_type, return_type, [&]() {
                    auto fixed = field.value.type.struct_def->fixed;

                    writer.SetValue("seek", Indirect("it + bufferPos", fixed));
                    writer += LookupFieldOneLine(
                        offset_val, "obj.init({{seek}}, bb)", "null");
                  });
            }
            break;
          case BASE_TYPE_STRING:
            // create string getter
            // e.g.
            // val Name : String?
            //     get() = {
            //         val o = offset(10)
            //         return if (o != 0) string(o + bufferPos) else null
            //     }
            // ? adds nullability annotation
            GenerateGetterOneLine(writer, field_name, return_type, [&]() {
              writer += LookupFieldOneLine(offset_val, "string(it + bufferPos)",
                                           "null");
            });
            break;
          case BASE_TYPE_VECTOR: {
            // e.g.
            // fun inventory(j: Int) : UByte {
            //     val o = offset(14)
            //     return if (o != 0) {
            //         bb.get(vector(it) + j * 1).toUByte()
            //     } else {
            //        0
            //     }
            // }

            auto vectortype = field.value.type.VectorType();
            std::string params = "j: Int";

            if (vectortype.base_type == BASE_TYPE_STRUCT ||
                vectortype.base_type == BASE_TYPE_UNION) {
              params = "obj: " + field_type + ", j: Int";
            }

            GenerateFunOneLine(writer, field_name, params, return_type, [&]() {
              auto inline_size = NumToString(InlineSize(vectortype));
              auto index = "vector(it) + j * " + inline_size;
              std::string found = "";
              writer.SetValue("index", index);

              if (IsEnum(vectortype)) {
                found = "{{field_type}}({{bbgetter}}({{index}}))";
              } else {
                switch (vectortype.base_type) {
                  case BASE_TYPE_STRUCT: {
                    bool fixed = vectortype.struct_def->fixed;
                    writer.SetValue("index", Indirect(index, fixed));
                    found = "obj.init({{index}}, bb)";
                    break;
                  }
                  case BASE_TYPE_UNION:
                    found = "{{bbgetter}}(obj, {{index}})";
                    break;
                  case BASE_TYPE_UTYPE:
                    found = "{{field_type}}({{bbgetter}}({{index}}))";
                    break;
                  default: found = "{{bbgetter}}({{index}})";
                }
              }
              writer +=
                  LookupFieldOneLine(offset_val, found, "{{field_default}}");
            });
            break;
          }
          case BASE_TYPE_UNION:
            GenerateFunOneLine(
                writer, field_name, "obj: " + field_type, return_type, [&]() {
                  writer += LookupFieldOneLine(
                      offset_val, bbgetter + "(obj, it + bufferPos)", "null");
                });
            break;
          default: FLATBUFFERS_ASSERT(0);
        }
      }

      if (value_base_type == BASE_TYPE_VECTOR) {
        // Generate Lenght functions for vectors
        GenerateGetterOneLine(writer, field_name + "Length", "Int", [&]() {
          writer += LookupFieldOneLine(offset_val, "vectorLength(it)", "0");
        });

        // See if we should generate a by-key accessor.
        if (field.value.type.element == BASE_TYPE_STRUCT &&
            !field.value.type.struct_def->fixed) {
          auto &sd = *field.value.type.struct_def;
          auto &fields = sd.fields.vec;
          for (auto kit = fields.begin(); kit != fields.end(); ++kit) {
            auto &kfield = **kit;
            if (kfield.key) {
              auto qualified_name = TypeInNameSpace(sd);
              auto name = namer_.Method(field, "ByKey");
              auto params = "key: " + GenTypeGet(kfield.value.type);
              auto rtype = qualified_name + "?";
              GenerateFunOneLine(writer, name, params, rtype, [&]() {
                writer += LookupFieldOneLine(
                    offset_val,
                    qualified_name + ".lookupByKey(null, vector(it), key, bb)",
                    "null");
              });

              auto param2 = "obj: " + qualified_name +
                            ", key: " + GenTypeGet(kfield.value.type);
              GenerateFunOneLine(writer, name, param2, rtype, [&]() {
                writer += LookupFieldOneLine(
                    offset_val,
                    qualified_name + ".lookupByKey(obj, vector(it), key, bb)",
                    "null");
              });

              break;
            }
          }
        }
      }

      if ((value_base_type == BASE_TYPE_VECTOR &&
           IsScalar(field.value.type.VectorType().base_type)) ||
          value_base_type == BASE_TYPE_STRING) {
        auto end_idx =
            NumToString(value_base_type == BASE_TYPE_STRING
                            ? 1
                            : InlineSize(field.value.type.VectorType()));

        // Generate a ByteBuffer accessor for strings & vectors of scalars.
        // e.g.
        // fun inventoryInByteBuffer(buffer: Bytebuffer):
        //     ByteBuffer = vectorAsBuffer(buffer, 14, 1)
        GenerateFunOneLine(
            writer, field_name + "AsBuffer", "", "ReadBuffer", [&]() {
              writer.SetValue("end", end_idx);
              writer += "vectorAsBuffer(bb, {{offset}}, {{end}})";
            });
      }

      // generate object accessors if is nested_flatbuffer
      // fun testnestedflatbufferAsMonster() : Monster?
      //{ return testnestedflatbufferAsMonster(new Monster()); }

      if (field.nested_flatbuffer) {
        auto nested_type_name = TypeInNameSpace(*field.nested_flatbuffer);
        auto nested_method_name =
            field_name + "As" + field.nested_flatbuffer->name;

        GenerateGetterOneLine(
            writer, nested_method_name, nested_type_name + "?", [&]() {
              writer += nested_method_name + "(" + nested_type_name + "())";
            });

        GenerateFunOneLine(
            writer, nested_method_name, "obj: " + nested_type_name,
            nested_type_name + "?", [&]() {
              writer += LookupFieldOneLine(
                  offset_val, "obj.init(indirect(vector(it)), bb)", "null");
            });
      }

      writer += "";  // Initial line break between fields
    }
    if (struct_def.has_key && !struct_def.fixed) {
      // Key Comparison method
      GenerateOverrideFun(
          writer, "keysCompare",
          "o1: Offset<*>, o2: Offset<*>, buffer: ReadWriteBuffer", "Int",
          [&]() {
            if (IsString(key_field->value.type)) {
              writer.SetValue("offset", NumToString(key_field->value.offset));
              writer +=
                  " return compareStrings(offset({{offset}}, o1, "
                  "buffer), offset({{offset}}, o2, buffer), buffer)";

            } else {
              auto getter1 = GenLookupByKey(key_field, "buffer", "o1");
              auto getter2 = GenLookupByKey(key_field, "buffer", "o2");
              writer += "val a = " + getter1;
              writer += "val b = " + getter2;
              writer += "return (a - b).toInt().sign()";
            }
          });
    }
  }